

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O3

size_t fctkern__tst_cnt(fctkern_t *nk)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  
  if (nk == (fctkern_t *)0x0) {
    __assert_fail("nk != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x8dc
                  ,"size_t fctkern__tst_cnt(const fctkern_t *)");
  }
  sVar1 = (nk->ts_list).used_itm_num;
  sVar4 = 0;
  if (sVar1 != 0) {
    uVar3 = 0;
    do {
      if ((nk->ts_list).used_itm_num <= uVar3) {
        __assert_fail("idx < list->used_itm_num",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x322,"void *fct_nlist__at(const fct_nlist_t *, size_t)");
      }
      sVar2 = fct_ts__tst_cnt((fct_ts_t *)(nk->ts_list).itm_list[uVar3]);
      sVar4 = sVar4 + sVar2;
      uVar3 = uVar3 + 1;
    } while (sVar1 != uVar3);
  }
  return sVar4;
}

Assistant:

static size_t
fctkern__tst_cnt(fctkern_t const *nk)
{
    size_t tally =0;
    FCT_ASSERT( nk != NULL );
    FCT_NLIST_FOREACH_BGN(fct_ts_t *, ts, &(nk->ts_list))
    {
        tally += fct_ts__tst_cnt(ts);
    }
    FCT_NLIST_FOREACH_END();
    return tally;
}